

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFileListGeneratorBase::Consider
          (cmFileListGeneratorBase *this,string *fullPath,cmFileList *listing)

{
  cmFileList *pcVar1;
  int iVar2;
  cmFileListGeneratorBase *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  cmFileList *local_28;
  cmFileList *listing_local;
  string *fullPath_local;
  cmFileListGeneratorBase *this_local;
  
  local_28 = listing;
  listing_local = (cmFileList *)fullPath;
  fullPath_local = (string *)this;
  pcVar3 = ::cm::auto_ptr<cmFileListGeneratorBase>::get(&this->Next);
  pcVar1 = local_28;
  if (pcVar3 == (cmFileListGeneratorBase *)0x0) {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   listing_local,"/");
    iVar2 = (*pcVar1->_vptr_cmFileList[2])(pcVar1,&local_78);
    this_local._7_1_ = (byte)iVar2 & 1;
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    pcVar3 = ::cm::auto_ptr<cmFileListGeneratorBase>::operator->(&this->Next);
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   listing_local,"/");
    iVar2 = (*pcVar3->_vptr_cmFileListGeneratorBase[2])(pcVar3,&local_48,local_28);
    this_local._7_1_ = (byte)iVar2 & 1;
    std::__cxx11::string::~string((string *)&local_48);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileListGeneratorBase::Consider(std::string const& fullPath,
                                       cmFileList& listing)
{
  if (this->Next.get()) {
    return this->Next->Search(fullPath + "/", listing);
  }
  return listing.Visit(fullPath + "/");
}